

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

void __thiscall ON_NurbsCurve::Internal_InitializeToZero(ON_NurbsCurve *this)

{
  ON_NurbsCurve *this_local;
  
  this->m_dim = 0;
  this->m_is_rat = 0;
  this->m_order = 0;
  this->m_cv_count = 0;
  this->m_knot_capacity_and_tags = 0;
  this->m_knot = (double *)0x0;
  this->m_cv_stride = 0;
  this->m_cv_capacity = 0;
  this->m_cv = (double *)0x0;
  return;
}

Assistant:

void ON_NurbsCurve::Internal_InitializeToZero()
{
  m_dim = 0;
  m_is_rat = 0;
  m_order = 0;
  m_cv_count = 0;
  m_knot_capacity_and_tags = 0;
  m_knot = 0;
  m_cv_stride = 0;
  m_cv_capacity = 0;
  m_cv = 0;
}